

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O3

uint8_t * svb_insert_scalar_d1_init
                    (uint8_t *keyPtr,uint8_t *dataPtr,size_t dataSize,uint32_t count,uint32_t prev,
                    uint32_t new_key,uint32_t *position)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  sbyte sVar8;
  uint8_t *puVar9;
  int iVar10;
  uint uVar11;
  uint32_t uVar12;
  int iVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  byte bVar19;
  uint *__src;
  ulong uVar21;
  ushort uVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  uint32_t local_4c;
  uint local_48;
  uint local_44;
  uint8_t *local_40;
  undefined1 (*local_38) [64];
  uint uVar20;
  
  local_4c = new_key;
  if (count == 0) {
    *position = 0;
    local_40 = svb_encode_scalar_d1_init(&local_4c,keyPtr,dataPtr,1,prev);
  }
  else {
    uVar16 = (uint)*keyPtr;
    local_40 = dataPtr + dataSize;
    uVar20 = 0;
    uVar12 = 0;
    __src = (uint *)dataPtr;
    do {
      if ((char)uVar20 == '\b') {
        uVar16 = (uint)(byte)(*(undefined1 (*) [64])keyPtr)[1];
        keyPtr = *(undefined1 (*) [64])keyPtr + 1;
        uVar20 = 0;
      }
      uVar11 = uVar16 >> (uVar20 & 0x1f);
      switch(uVar11 & 3) {
      case 0:
        uVar18 = (uint)(byte)*__src;
        lVar17 = 1;
        break;
      case 1:
        uVar18 = (uint)(ushort)*__src;
        lVar17 = 2;
        break;
      case 2:
        lVar17 = 3;
        uVar18 = (uint)(uint3)*__src;
        break;
      case 3:
        uVar18 = *__src;
        lVar17 = 4;
      }
      uVar18 = uVar18 + prev;
      uVar15 = new_key - uVar18;
      bVar19 = (byte)uVar20;
      if (new_key < uVar18 || uVar15 == 0) {
        local_38 = (undefined1 (*) [64])(*(undefined1 (*) [64])keyPtr + 1);
        sVar8 = (bVar19 < 0x21) * (' ' - bVar19);
        uVar16 = (-1 << (uVar20 & 0x1f) & uVar16) << 2 | (uVar16 << sVar8) >> sVar8;
        if (dataPtr <= local_38) {
          local_48 = new_key - prev;
          iVar10 = 1;
          iVar13 = 1;
          if ((0xff < local_48) && (iVar13 = 2, 0xffff < local_48)) {
            iVar13 = 4 - (uint)(local_48 < 0x1000000);
          }
          uVar15 = uVar18 - new_key;
          if ((0xff < uVar15) && (iVar10 = 2, 0xffff < uVar15)) {
            iVar10 = 4 - (uint)(uVar15 < 0x1000000);
          }
          iVar13 = iVar13 + (~uVar11 | 0xfffffffc);
          local_44 = iVar13 + iVar10;
          if (local_44 != 0 && SCARRY4(iVar13,iVar10) == (int)local_44 < 0) {
            memmove((byte *)((ulong)local_44 + (long)__src),__src,(long)local_40 - (long)__src);
          }
          if (local_48 < 0x100) {
            *(byte *)__src = (byte)local_48;
            iVar10 = 0;
            lVar17 = 1;
          }
          else if (local_48 < 0x10000) {
            *(ushort *)__src = (ushort)local_48;
            iVar10 = 1;
            lVar17 = 2;
          }
          else if (local_48 < 0x1000000) {
            *(ushort *)__src = (ushort)local_48;
            iVar10 = 2;
            *(byte *)((long)__src + 2) = (byte)(local_48 >> 0x10);
            lVar17 = 3;
          }
          else {
            *__src = local_48;
            iVar10 = 3;
            lVar17 = 4;
          }
          iVar13 = 0;
          (*(undefined1 (*) [64])keyPtr)[0] = (byte)(iVar10 << (uVar20 & 0x1f)) | (byte)uVar16;
          uVar16 = (uint)(byte)(bVar19 + 2);
          if ((byte)(bVar19 + 2) == 8) {
            uVar16 = 0;
            keyPtr = (uint8_t *)local_38;
          }
          uVar18 = uVar18 - local_4c;
          if (uVar18 < 0x100) {
            *(byte *)((long)__src + lVar17) = (byte)uVar18;
          }
          else if (uVar18 < 0x10000) {
            *(short *)((long)__src + lVar17) = (short)uVar18;
            iVar13 = 1;
          }
          else if (uVar18 < 0x1000000) {
            *(short *)((long)__src + lVar17) = (short)uVar18;
            iVar13 = 2;
            *(byte *)((long)__src + lVar17 + 2) = (byte)(uVar18 >> 0x10);
          }
          else {
            iVar13 = 3;
            *(uint *)((long)__src + lVar17) = uVar18;
          }
          (*(undefined1 (*) [64])keyPtr)[0] =
               (byte)(iVar13 << (uVar16 & 0x1f)) |
               ~(byte)(3 << (uVar16 & 0x1f)) & (*(undefined1 (*) [64])keyPtr)[0];
          *position = uVar12;
          return local_40 + (int)local_44;
        }
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
        auVar24 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
        auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar31 = vpbroadcastq_avx512f(ZEXT816(0x4080000000000000));
        auVar32 = vpbroadcastq_avx512f(ZEXT816(0x10204081020));
        auVar33 = vpbroadcastb_avx512bw();
        auVar34 = vpbroadcastq_avx512f();
        auVar35 = vpbroadcastq_avx512f();
        auVar23 = vporq_avx512f(auVar35,auVar23);
        auVar27 = vporq_avx512f(auVar35,auVar27);
        auVar29 = vporq_avx512f(auVar35,auVar29);
        auVar24 = vporq_avx512f(auVar35,auVar24);
        auVar25 = vporq_avx512f(auVar35,auVar25);
        auVar26 = vporq_avx512f(auVar35,auVar26);
        auVar28 = vporq_avx512f(auVar35,auVar28);
        auVar30 = vporq_avx512f(auVar35,auVar30);
        uVar1 = vpcmpuq_avx512f(auVar30,auVar34,2);
        uVar2 = vpcmpuq_avx512f(auVar29,auVar34,2);
        uVar3 = vpcmpuq_avx512f(auVar27,auVar34,2);
        uVar4 = vpcmpuq_avx512f(auVar23,auVar34,2);
        bVar19 = (byte)uVar4;
        uVar4 = vpcmpuq_avx512f(auVar28,auVar34,2);
        uVar5 = vpcmpuq_avx512f(auVar25,auVar34,2);
        uVar6 = vpcmpuq_avx512f(auVar26,auVar34,2);
        uVar7 = vpcmpuq_avx512f(auVar24,auVar34,2);
        uVar22 = CONCAT11(bVar19,(byte)uVar7);
        uVar20 = CONCAT22(uVar22,CONCAT11((byte)uVar5,(byte)uVar6));
        uVar21 = CONCAT44(uVar20,CONCAT22(CONCAT11((byte)uVar3,(byte)uVar4),
                                          CONCAT11((byte)uVar2,(byte)uVar1)));
        auVar23 = vmovdqu8_avx512bw(*local_38);
        auVar24[1] = ((byte)(uVar21 >> 1) & 1) * auVar23[1];
        auVar24[0] = ((byte)uVar1 & 1) * auVar23[0];
        auVar24[2] = ((byte)(uVar21 >> 2) & 1) * auVar23[2];
        auVar24[3] = ((byte)(uVar21 >> 3) & 1) * auVar23[3];
        auVar24[4] = ((byte)(uVar21 >> 4) & 1) * auVar23[4];
        auVar24[5] = ((byte)(uVar21 >> 5) & 1) * auVar23[5];
        auVar24[6] = ((byte)(uVar21 >> 6) & 1) * auVar23[6];
        auVar24[7] = ((byte)(uVar21 >> 7) & 1) * auVar23[7];
        auVar24[8] = ((byte)uVar2 & 1) * auVar23[8];
        auVar24[9] = ((byte)(uVar21 >> 9) & 1) * auVar23[9];
        auVar24[10] = ((byte)(uVar21 >> 10) & 1) * auVar23[10];
        auVar24[0xb] = ((byte)(uVar21 >> 0xb) & 1) * auVar23[0xb];
        auVar24[0xc] = ((byte)(uVar21 >> 0xc) & 1) * auVar23[0xc];
        auVar24[0xd] = ((byte)(uVar21 >> 0xd) & 1) * auVar23[0xd];
        auVar24[0xe] = ((byte)(uVar21 >> 0xe) & 1) * auVar23[0xe];
        auVar24[0xf] = ((byte)(uVar21 >> 0xf) & 1) * auVar23[0xf];
        auVar24[0x10] = ((byte)uVar4 & 1) * auVar23[0x10];
        auVar24[0x11] = ((byte)(uVar21 >> 0x11) & 1) * auVar23[0x11];
        auVar24[0x12] = ((byte)(uVar21 >> 0x12) & 1) * auVar23[0x12];
        auVar24[0x13] = ((byte)(uVar21 >> 0x13) & 1) * auVar23[0x13];
        auVar24[0x14] = ((byte)(uVar21 >> 0x14) & 1) * auVar23[0x14];
        auVar24[0x15] = ((byte)(uVar21 >> 0x15) & 1) * auVar23[0x15];
        auVar24[0x16] = ((byte)(uVar21 >> 0x16) & 1) * auVar23[0x16];
        auVar24[0x17] = ((byte)(uVar21 >> 0x17) & 1) * auVar23[0x17];
        auVar24[0x18] = ((byte)uVar3 & 1) * auVar23[0x18];
        auVar24[0x19] = ((byte)(uVar21 >> 0x19) & 1) * auVar23[0x19];
        auVar24[0x1a] = ((byte)(uVar21 >> 0x1a) & 1) * auVar23[0x1a];
        auVar24[0x1b] = ((byte)(uVar21 >> 0x1b) & 1) * auVar23[0x1b];
        auVar24[0x1c] = ((byte)(uVar21 >> 0x1c) & 1) * auVar23[0x1c];
        auVar24[0x1d] = ((byte)(uVar21 >> 0x1d) & 1) * auVar23[0x1d];
        auVar24[0x1e] = ((byte)(uVar21 >> 0x1e) & 1) * auVar23[0x1e];
        auVar24[0x1f] = ((byte)(uVar21 >> 0x1f) & 1) * auVar23[0x1f];
        auVar24[0x20] = ((byte)uVar6 & 1) * auVar23[0x20];
        auVar24[0x21] = ((byte)(uVar20 >> 1) & 1) * auVar23[0x21];
        auVar24[0x22] = ((byte)(uVar20 >> 2) & 1) * auVar23[0x22];
        auVar24[0x23] = ((byte)(uVar20 >> 3) & 1) * auVar23[0x23];
        auVar24[0x24] = ((byte)(uVar20 >> 4) & 1) * auVar23[0x24];
        auVar24[0x25] = ((byte)(uVar20 >> 5) & 1) * auVar23[0x25];
        auVar24[0x26] = ((byte)(uVar20 >> 6) & 1) * auVar23[0x26];
        auVar24[0x27] = ((byte)(uVar20 >> 7) & 1) * auVar23[0x27];
        auVar24[0x28] = ((byte)uVar5 & 1) * auVar23[0x28];
        auVar24[0x29] = ((byte)(uVar20 >> 9) & 1) * auVar23[0x29];
        auVar24[0x2a] = ((byte)(uVar20 >> 10) & 1) * auVar23[0x2a];
        auVar24[0x2b] = ((byte)(uVar20 >> 0xb) & 1) * auVar23[0x2b];
        auVar24[0x2c] = ((byte)(uVar20 >> 0xc) & 1) * auVar23[0x2c];
        auVar24[0x2d] = ((byte)(uVar20 >> 0xd) & 1) * auVar23[0x2d];
        auVar24[0x2e] = ((byte)(uVar20 >> 0xe) & 1) * auVar23[0x2e];
        auVar24[0x2f] = ((byte)(uVar20 >> 0xf) & 1) * auVar23[0x2f];
        auVar24[0x30] = ((byte)uVar7 & 1) * auVar23[0x30];
        auVar24[0x31] = ((byte)(uVar22 >> 1) & 1) * auVar23[0x31];
        auVar24[0x32] = ((byte)(uVar22 >> 2) & 1) * auVar23[0x32];
        auVar24[0x33] = ((byte)(uVar22 >> 3) & 1) * auVar23[0x33];
        auVar24[0x34] = ((byte)(uVar22 >> 4) & 1) * auVar23[0x34];
        auVar24[0x35] = ((byte)(uVar22 >> 5) & 1) * auVar23[0x35];
        auVar24[0x36] = ((byte)(uVar22 >> 6) & 1) * auVar23[0x36];
        auVar24[0x37] = ((byte)(uVar22 >> 7) & 1) * auVar23[0x37];
        auVar24[0x38] = (bVar19 & 1) * auVar23[0x38];
        auVar24[0x39] = (bVar19 >> 1 & 1) * auVar23[0x39];
        auVar24[0x3a] = (bVar19 >> 2 & 1) * auVar23[0x3a];
        auVar24[0x3b] = (bVar19 >> 3 & 1) * auVar23[0x3b];
        auVar24[0x3c] = (bVar19 >> 4 & 1) * auVar23[0x3c];
        auVar24[0x3d] = (bVar19 >> 5 & 1) * auVar23[0x3d];
        auVar24[0x3e] = (bVar19 >> 6 & 1) * auVar23[0x3e];
        auVar24[0x3f] = -((char)bVar19 >> 7) * auVar23[0x3f];
        auVar23 = vgf2p8affineqb_avx512f(auVar24,auVar31,0);
        vgf2p8affineqb_avx512f(auVar24,auVar32,0);
        auVar24 = valignq_avx512f(auVar23,auVar33,6);
        vpalignr_avx512bw(auVar23,auVar24);
        puVar9 = (uint8_t *)
                 (*pcRamffffffffffffffd1)
                           (uVar16 >> 8 & 0xffffff03,~(ulong)keyPtr,0,
                            (ulong)(dataPtr + ~(ulong)keyPtr + 0x3f) & 0xffffffffffffffc0);
        return puVar9;
      }
      __src = (uint *)((long)__src + lVar17);
      bVar19 = bVar19 + 2;
      uVar20 = (uint)bVar19;
      uVar12 = uVar12 + 1;
      prev = uVar18;
    } while (count != uVar12);
    uVar20 = (uint)bVar19;
    if (bVar19 == 8) {
      uVar20 = 0;
    }
    if (uVar15 < 0x100) {
      *(byte *)__src = (byte)uVar15;
      bVar14 = 0;
    }
    else if (uVar15 < 0x10000) {
      *(ushort *)__src = (ushort)uVar15;
      bVar14 = 1;
    }
    else if (uVar15 < 0x1000000) {
      *(ushort *)__src = (ushort)uVar15;
      bVar14 = 2;
      *(byte *)((long)__src + 2) = (byte)(uVar15 >> 0x10);
    }
    else {
      bVar14 = 3;
      *__src = uVar15;
    }
    local_40 = local_40 + (ulong)bVar14 + 1;
    (*(undefined1 (*) [64])keyPtr)[bVar19 == 8] =
         bVar14 << (uVar20 & 0x1f) | ~(byte)(3 << (uVar20 & 0x1f)) & (byte)uVar16;
    *position = count;
  }
  return local_40;
}

Assistant:

uint8_t *svb_insert_scalar_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                   size_t dataSize, uint32_t count,
                                   uint32_t prev, uint32_t new_key,
                                   uint32_t *position) {
  if (count == 0) {
    *position = 0;
    return svb_encode_scalar_d1_init(&new_key, keyPtr, dataPtr, 1, prev);
  }

  uint8_t shift = 0;
  uint32_t key = *keyPtr;
  uint8_t *dataPtrBegin = dataPtr;

  for (uint32_t c = 0; c < count; c++) {
    uint8_t *dataPtrPrev = dataPtr;

    if (shift == 8) {
      shift = 0;
      key = *(++keyPtr);
    }

    uint8_t current_key_code = (key >> shift) & 0x3;
    uint32_t current_key = prev + _decode_data(&dataPtr, current_key_code);
    if (current_key >= new_key) {
      // rewind to the insertion position
      dataPtr = dataPtrPrev;

      // shift keys 2 bits "to the right"
      uint32_t mask_hi = key & (~0u << shift);
      uint32_t mask_lo = key & ((1 << shift) - 1);
      key = (mask_hi << 2) | mask_lo;
      uint32_t carry_bits, prev_carry_bits = (key & (3 << 8)) >> 8;

      for (uint8_t *p = keyPtr + 1; p < dataPtrBegin; p++) {
        carry_bits = (*p & (3 << 6)) >> 6;
        *p <<= 2;
        *p |= prev_carry_bits;
        prev_carry_bits = carry_bits;
      }

      // shift values n bytes "to the right", then insert the new key
      // and the updated delta of the next key
      int gap = _encoded_length(new_key - prev) +
                _encoded_length(current_key - new_key) - (current_key_code + 1);
      assert(gap >= 0);
      if (gap > 0)
        memmove(dataPtr + gap, dataPtr, dataSize - (dataPtr - dataPtrBegin));

      // first insert the new key
      uint8_t code = _encode_data(new_key - prev, &dataPtr);
      *keyPtr = (uint8_t)(key | (code << shift));

      // then update the current key
      shift += 2;
      if (shift == 8) {
        shift = 0;
        keyPtr++;
      }
      code = _encode_data(current_key - new_key, &dataPtr);
      *keyPtr &= ~(3 << shift);
      *keyPtr |= (code << shift);

      *position = c;
      return dataPtrBegin + dataSize + gap;
    }

    prev = current_key;
    shift += 2;
  }

  // append the new key at the end
  if (shift == 8) {
    shift = 0;
    keyPtr++;
  }

  uint8_t code = _encode_data(new_key - prev, &dataPtr);
  key &= ~(3 << shift);
  key |= code << shift;
  *keyPtr = (uint8_t)(key); // write last key (no increment needed)

  *position = count;
  return dataPtrBegin + dataSize + code + 1;
}